

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O1

void __thiscall
QTextBrowserPrivate::restoreHistoryEntry(QTextBrowserPrivate *this,HistoryEntry *entry)

{
  QTextDocument *pQVar1;
  long in_FS_OFFSET;
  QTextCursor cursor;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  setSource(this,&entry->url,entry->type);
  QAbstractSlider::setValue
            (&((this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.hbar)->
              super_QAbstractSlider,entry->hpos);
  QAbstractSlider::setValue
            (&((this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.vbar)->
              super_QAbstractSlider,entry->vpos);
  if ((entry->focusIndicatorAnchor != -1) && (entry->focusIndicatorPosition != -1)) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = QWidgetTextControl::document
                       ((QWidgetTextControl *)(this->super_QTextEditPrivate).control);
    QTextCursor::QTextCursor((QTextCursor *)&local_28,pQVar1);
    QTextCursor::setPosition((int)&local_28,entry->focusIndicatorAnchor);
    QTextCursor::setPosition((int)&local_28,entry->focusIndicatorPosition);
    QWidgetTextControl::setTextCursor
              ((QWidgetTextControl *)(this->super_QTextEditPrivate).control,(QTextCursor *)&local_28
               ,false);
    QWidgetTextControl::setCursorIsFocusIndicator
              ((QWidgetTextControl *)(this->super_QTextEditPrivate).control,true);
    QTextCursor::~QTextCursor((QTextCursor *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowserPrivate::restoreHistoryEntry(const HistoryEntry &entry)
{
    setSource(entry.url, entry.type);
    hbar->setValue(entry.hpos);
    vbar->setValue(entry.vpos);
    if (entry.focusIndicatorAnchor != -1 && entry.focusIndicatorPosition != -1) {
        QTextCursor cursor(control->document());
        cursor.setPosition(entry.focusIndicatorAnchor);
        cursor.setPosition(entry.focusIndicatorPosition, QTextCursor::KeepAnchor);
        control->setTextCursor(cursor);
        control->setCursorIsFocusIndicator(true);
    }
#ifdef QT_KEYPAD_NAVIGATION
    lastKeypadScrollValue = vbar->value();
    prevFocus = control->textCursor();

    Q_Q(QTextBrowser);
    const QString href = prevFocus.charFormat().anchorHref();
    QUrl url = resolveUrl(href);
    emitHighlighted(url);
#endif
}